

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::PositionalReferenceExpression::Deserialize
          (PositionalReferenceExpression *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  PositionalReferenceExpression *this_00;
  pointer pPVar3;
  undefined4 extraout_var;
  pointer *__ptr;
  unique_ptr<duckdb::PositionalReferenceExpression,_std::default_delete<duckdb::PositionalReferenceExpression>,_true>
  result;
  _Head_base<0UL,_duckdb::PositionalReferenceExpression_*,_false> local_28;
  idx_t iVar4;
  
  this_00 = (PositionalReferenceExpression *)operator_new(0x40);
  PositionalReferenceExpression(this_00);
  local_28._M_head_impl = this_00;
  pPVar3 = unique_ptr<duckdb::PositionalReferenceExpression,_std::default_delete<duckdb::PositionalReferenceExpression>,_true>
           ::operator->((unique_ptr<duckdb::PositionalReferenceExpression,_std::default_delete<duckdb::PositionalReferenceExpression>,_true>
                         *)&local_28);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"index");
  if ((char)uVar1 == '\0') {
    iVar4 = 0;
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar4 = CONCAT44(extraout_var,iVar2);
  }
  pPVar3->index = iVar4;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_28._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> PositionalReferenceExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<PositionalReferenceExpression>(new PositionalReferenceExpression());
	deserializer.ReadPropertyWithDefault<idx_t>(200, "index", result->index);
	return std::move(result);
}